

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

void __thiscall mocker::ir::FunctionModule::sortBasicBlocks(FunctionModule *this)

{
  FunctionModule *this_local;
  
  std::__cxx11::list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>>::
  sort<mocker::ir::FunctionModule::sortBasicBlocks()::__0>
            ((list<mocker::ir::BasicBlock,std::allocator<mocker::ir::BasicBlock>> *)&this->bbs);
  return;
}

Assistant:

void FunctionModule::sortBasicBlocks() {
  bbs.sort([](const BasicBlock &lhs, const BasicBlock &rhs) {
    return lhs.getLabelID() < rhs.getLabelID();
  });
}